

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

pool_ref<soul::AST::UsingDeclaration> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::UsingDeclaration>
          (RewritingASTVisitor *this,pool_ref<soul::AST::UsingDeclaration> *o)

{
  Expression *pEVar1;
  long lVar2;
  undefined8 *in_RDX;
  
  pEVar1 = visitObject((RewritingASTVisitor *)o,(Expression *)*in_RDX);
  lVar2 = __dynamic_cast(pEVar1,&AST::Expression::typeinfo,&AST::UsingDeclaration::typeinfo,0);
  if (lVar2 != 0) {
    this->_vptr_RewritingASTVisitor = (_func_int **)pEVar1;
    return (pool_ref<soul::AST::UsingDeclaration>)(UsingDeclaration *)this;
  }
  throwInternalCompilerError("is_type<Type> (result)","visitAs",0x1d5);
}

Assistant:

pool_ref<Type> visitAs (pool_ref<Type> o)
    {
        auto& result = visitObject (o.getReference());
        SOUL_ASSERT (is_type<Type> (result));
        return static_cast<Type&> (result);
    }